

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen.cpp
# Opt level: O0

void phaeton::CodeGen::unpackPairList(TupleList *TList,List *Left,List *Right)

{
  int iVar1;
  bool bVar2;
  const_reference pvVar3;
  value_type local_58;
  value_type local_50;
  value_type local_48;
  value_type local_44;
  int R;
  int L;
  vector<int,_std::allocator<int>_> *T;
  const_iterator __end1;
  const_iterator __begin1;
  TupleList *__range1;
  List *Right_local;
  List *Left_local;
  TupleList *TList_local;
  
  bVar2 = isPairList(TList);
  if (!bVar2) {
    __assert_fail("isPairList(TList)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/lijiansong[P]Phaeton/lib/CodeGen/CodeGen.cpp"
                  ,0xa6,
                  "static void phaeton::CodeGen::unpackPairList(const TupleList &, List &, List &)")
    ;
  }
  std::vector<int,_std::allocator<int>_>::clear(Left);
  std::vector<int,_std::allocator<int>_>::clear(Right);
  __end1 = std::
           vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ::begin(TList);
  T = (vector<int,_std::allocator<int>_> *)
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::end(TList);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                *)&T);
    if (!bVar2) break;
    _R = __gnu_cxx::
         __normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
         ::operator*(&__end1);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](_R,0);
    iVar1 = *pvVar3;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](_R,1);
    if (iVar1 < *pvVar3) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](_R,0);
      local_50 = *pvVar3;
    }
    else {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](_R,1);
      local_50 = *pvVar3;
    }
    local_44 = local_50;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](_R,0);
    iVar1 = *pvVar3;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](_R,1);
    if (iVar1 < *pvVar3) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](_R,1);
      local_58 = *pvVar3;
    }
    else {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](_R,0);
      local_58 = *pvVar3;
    }
    local_48 = local_58;
    std::vector<int,_std::allocator<int>_>::push_back(Left,&local_44);
    std::vector<int,_std::allocator<int>_>::push_back(Right,&local_48);
    __gnu_cxx::
    __normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void CodeGen::unpackPairList(const TupleList &TList, List &Left, List &Right) {
  assert(isPairList(TList));

  Left.clear();
  Right.clear();
  for (const auto &T : TList) {
    int L = (T[0] < T[1]) ? T[0] : T[1];
    int R = (T[0] < T[1]) ? T[1] : T[0];
    Left.push_back(L);
    Right.push_back(R);
  }
}